

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

ssize_t __thiscall llvm::raw_ostream::write(raw_ostream *this,int __fd,void *__buf,size_t __n)

{
  undefined8 in_RAX;
  char *pcVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  do {
    pcVar1 = this->OutBufCur;
    if (pcVar1 < this->OutBufEnd) {
LAB_00159a8f:
      this->OutBufCur = pcVar1 + 1;
      *pcVar1 = (char)__fd;
      return (ssize_t)this;
    }
    if (this->OutBufStart != (char *)0x0) {
      flush_nonempty(this);
      pcVar1 = this->OutBufCur;
      goto LAB_00159a8f;
    }
    if (this->BufferMode == Unbuffered) {
      uStack_18 = CONCAT17((char)__fd,(undefined7)uStack_18);
      (*this->_vptr_raw_ostream[7])(this,(long)&uStack_18 + 7,1);
      return (ssize_t)this;
    }
    SetBuffered(this);
  } while( true );
}

Assistant:

raw_ostream &raw_ostream::write(unsigned char C) {
  // Group exceptional cases into a single branch.
  if (LLVM_UNLIKELY(OutBufCur >= OutBufEnd)) {
    if (LLVM_UNLIKELY(!OutBufStart)) {
      if (BufferMode == Unbuffered) {
        write_impl(reinterpret_cast<char*>(&C), 1);
        return *this;
      }
      // Set up a buffer and start over.
      SetBuffered();
      return write(C);
    }

    flush_nonempty();
  }

  *OutBufCur++ = C;
  return *this;
}